

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_decode_packets
                   (opj_tcd_t *tcd,opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_BYTE *p_src,OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_len,
                   opj_codestream_index_t *p_cstr_index,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  opj_tcp_t *poVar2;
  opj_tcd_precinct_t *poVar3;
  opj_tcd_resolution_t *poVar4;
  opj_tcd_seg_t *poVar5;
  opj_image_t *poVar6;
  OPJ_BOOL OVar7;
  OPJ_UINT32 OVar8;
  opj_pi_iterator_t *poVar9;
  void *__s;
  OPJ_BYTE *pOVar10;
  opj_tcd_seg_data_chunk_t *ptr;
  OPJ_UINT32 OVar11;
  opj_tcd_precinct_t **ppoVar12;
  opj_tcd_band_t *poVar13;
  opj_tcd_resolution_t *poVar14;
  OPJ_UINT32 OVar15;
  opj_tcd_seg_t *poVar16;
  uint uVar17;
  OPJ_BYTE *pOVar18;
  OPJ_UINT32 OVar19;
  ulong uVar20;
  uint uVar21;
  OPJ_UINT32 OVar22;
  uint uVar23;
  int iVar24;
  OPJ_UINT32 OVar25;
  opj_tcd_cblk_dec_t *poVar26;
  int iVar27;
  uint uVar28;
  OPJ_BYTE *pOVar29;
  OPJ_UINT32 OVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  opj_event_mgr_t *p_manager_00;
  OPJ_UINT32 local_d4;
  OPJ_UINT32 local_d0;
  OPJ_BOOL l_read_data;
  void *local_c8;
  opj_tcd_tile_t *local_c0;
  ulong local_b8;
  opj_pi_iterator_t *local_b0;
  ulong local_a8;
  OPJ_BYTE *local_a0;
  opj_tcp_t *local_98;
  opj_pi_iterator_t *local_90;
  opj_image_t *local_88;
  ulong local_80;
  uint local_74;
  uint local_70;
  int local_6c;
  opj_t2_t *local_68;
  OPJ_BYTE *local_60;
  opj_tcd_resolution_t *local_58;
  opj_tcd_band_t *local_50;
  OPJ_BYTE *local_48;
  OPJ_UINT32 *local_40;
  opj_tcd_t *local_38;
  
  local_88 = p_t2->image;
  poVar2 = p_t2->cp->tcps;
  OVar11 = poVar2[p_tile_no].numpocs;
  local_c0 = p_tile;
  local_68 = p_t2;
  local_40 = p_data_read;
  local_38 = tcd;
  poVar9 = opj_pi_create_decode(local_88,p_t2->cp,p_tile_no);
  if (poVar9 == (opj_pi_iterator_t *)0x0) {
LAB_00132466:
    OVar7 = 0;
  }
  else {
    local_b8 = (ulong)p_max_len;
    local_98 = poVar2 + p_tile_no;
    local_d0 = OVar11 + 1;
    uVar21 = 0;
    local_b0 = poVar9;
    local_a0 = p_src;
    local_48 = p_src;
    while (pOVar29 = local_48, poVar6 = local_88, uVar21 <= local_98->numpocs) {
      if (((poVar9->poc).prg == OPJ_PROG_UNKNOWN) ||
         (local_90 = poVar9, local_70 = uVar21, __s = opj_malloc((ulong)local_88->numcomps << 2),
         __s == (void *)0x0)) {
        opj_pi_destroy(local_b0,local_d0);
        goto LAB_00132466;
      }
      local_c8 = __s;
      memset(__s,1,(ulong)poVar6->numcomps << 2);
      poVar9 = local_90;
      while( true ) {
        p_manager_00 = (opj_event_mgr_t *)0x131ebd;
        OVar7 = opj_pi_next(poVar9);
        if (OVar7 == 0) break;
        if (poVar9->layno < local_98->num_layers_to_decode) {
          uVar21 = poVar9->resno;
          if (local_c0->comps[poVar9->compno].minimum_num_resolutions <= uVar21) goto LAB_001321ca;
          poVar14 = local_c0->comps[poVar9->compno].resolutions;
          p_manager_00 = (opj_event_mgr_t *)0xffffffffffffffff;
          uVar31 = 0xffffffffffffffff;
          ppoVar12 = &poVar14[uVar21].bands[0].precincts;
          do {
            uVar31 = uVar31 + 1;
            if (poVar14[uVar21].numbands <= uVar31) goto LAB_001321ca;
            poVar3 = *ppoVar12;
            uVar23 = poVar9->precno;
            p_manager_00 = (opj_event_mgr_t *)(ulong)(uint)poVar3[uVar23].y1;
            OVar7 = opj_tcd_is_subband_area_of_interest
                              (local_38,poVar9->compno,poVar9->resno,*(OPJ_UINT32 *)(ppoVar12 + -1),
                               poVar3[uVar23].x0,poVar3[uVar23].y0,poVar3[uVar23].x1,
                               poVar3[uVar23].y1);
            poVar9 = local_90;
            ppoVar12 = ppoVar12 + 6;
          } while (OVar7 == 0);
          *(undefined4 *)((long)local_c8 + (ulong)local_90->compno * 4) = 0;
          local_d4 = 0;
          OVar7 = opj_t2_read_packet_header
                            (local_68,local_c0,local_98,local_90,&l_read_data,local_a0,&local_d4,
                             (OPJ_UINT32)local_b8,(opj_packet_info_t *)p_manager,p_manager_00);
          if (OVar7 == 0) goto LAB_0013244e;
          uVar31 = (ulong)local_d4;
          uVar21 = poVar9->compno;
          uVar23 = poVar9->resno;
          local_a8 = uVar31;
          if (l_read_data != 0) {
            uVar17 = (int)local_b8 - local_d4;
            pOVar29 = local_a0 + uVar31;
            local_d4 = 0;
            poVar4 = local_c0->comps[uVar21].resolutions;
            poVar14 = poVar4 + uVar23;
            poVar13 = poVar4[uVar23].bands;
            pOVar18 = pOVar29 + uVar17;
            local_60 = pOVar29;
            local_58 = poVar14;
            for (uVar21 = 0; uVar21 < poVar14->numbands; uVar21 = uVar21 + 1) {
              if ((poVar13->x1 != poVar13->x0) && (poVar13->y1 != poVar13->y0)) {
                uVar23 = poVar9->precno;
                poVar3 = poVar13->precincts;
                iVar24 = poVar3[uVar23].ch * poVar3[uVar23].cw;
                poVar26 = poVar3[uVar23].cblks.dec;
                local_74 = uVar21;
                local_6c = iVar24;
                local_50 = poVar13;
                for (iVar27 = 0; poVar13 = local_50, poVar14 = local_58, uVar21 = local_74,
                    iVar27 != iVar24; iVar27 = iVar27 + 1) {
                  OVar11 = poVar26->numnewpasses;
                  if (OVar11 != 0) {
                    OVar8 = poVar26->numsegs;
                    poVar5 = poVar26->segs;
                    local_80 = CONCAT44(local_80._4_4_,iVar27);
                    if (OVar8 == 0) {
                      OVar8 = 1;
                      poVar16 = poVar5;
LAB_001320c6:
                      poVar26->numsegs = OVar8;
                    }
                    else {
                      uVar21 = OVar8 - 1;
                      poVar16 = poVar5 + uVar21;
                      if (poVar5[uVar21].numpasses == poVar5[uVar21].maxpasses) {
                        OVar8 = OVar8 + 1;
                        poVar16 = poVar16 + 1;
                        goto LAB_001320c6;
                      }
                    }
                    do {
                      OVar8 = poVar16->newlen;
                      uVar31 = (ulong)OVar8;
                      uVar20 = ~(ulong)pOVar29;
                      pOVar10 = pOVar29 + uVar31;
                      if (pOVar10 > pOVar18 || uVar31 > uVar20) {
                        OVar8 = (int)pOVar18 - (int)pOVar29;
                        poVar16->newlen = OVar8;
                      }
                      OVar25 = poVar26->numchunks;
                      ptr = poVar26->chunks;
                      OVar19 = OVar11;
                      if (OVar25 == poVar26->numchunksalloc) {
                        uVar21 = OVar25 * 2 + 1;
                        ptr = (opj_tcd_seg_data_chunk_t *)opj_realloc(ptr,(ulong)uVar21 << 4);
                        if (ptr == (opj_tcd_seg_data_chunk_t *)0x0) {
                          opj_event_msg(p_manager,1,
                                        "cannot allocate opj_tcd_seg_data_chunk_t* array");
                          goto LAB_0013244e;
                        }
                        poVar26->chunks = ptr;
                        poVar26->numchunksalloc = uVar21;
                        OVar25 = poVar26->numchunks;
                        OVar8 = poVar16->newlen;
                        poVar9 = local_90;
                        OVar19 = poVar26->numnewpasses;
                      }
                      ptr[OVar25].data = pOVar29;
                      ptr[OVar25].len = OVar8;
                      poVar26->numchunks = OVar25 + 1;
                      poVar16->len = poVar16->len + OVar8;
                      OVar25 = poVar16->numnewpasses;
                      OVar22 = poVar16->numpasses + OVar25;
                      poVar16->numpasses = OVar22;
                      OVar11 = OVar19 - OVar25;
                      poVar26->numnewpasses = OVar11;
                      poVar16->real_num_passes = OVar22;
                      if (OVar11 != 0) {
                        poVar16 = poVar16 + 1;
                        poVar26->numsegs = poVar26->numsegs + 1;
                      }
                      pOVar29 = pOVar29 + OVar8;
                    } while ((pOVar10 <= pOVar18 && uVar31 <= uVar20) && OVar19 != OVar25);
                    poVar26->real_num_segs = poVar26->numsegs;
                    uVar31 = local_a8;
                    iVar24 = local_6c;
                    iVar27 = (int)local_80;
                  }
                  poVar26 = poVar26 + 1;
                }
              }
              poVar13 = poVar13 + 1;
            }
            local_a8 = (ulong)(uint)((int)uVar31 + ((int)pOVar29 - (int)local_60));
            uVar21 = poVar9->compno;
            uVar23 = poVar9->resno;
          }
          uVar31 = (ulong)uVar21;
          uVar21 = local_88->comps[uVar31].resno_decoded;
          if (uVar21 < uVar23) {
            uVar21 = uVar23;
          }
          local_88->comps[uVar31].resno_decoded = uVar21;
          uVar20 = local_a8;
        }
        else {
LAB_001321ca:
          local_d4 = 0;
          OVar7 = opj_t2_read_packet_header
                            (local_68,local_c0,local_98,poVar9,&l_read_data,local_a0,&local_d4,
                             (OPJ_UINT32)local_b8,(opj_packet_info_t *)p_manager,p_manager_00);
          if (OVar7 == 0) {
LAB_0013244e:
            opj_pi_destroy(local_b0,local_d0);
            opj_free(local_c8);
            goto LAB_00132466;
          }
          uVar31 = (ulong)poVar9->compno;
          uVar20 = (ulong)local_d4;
          if (l_read_data != 0) {
            uVar21 = (int)local_b8 - local_d4;
            poVar14 = local_c0->comps[uVar31].resolutions;
            poVar13 = poVar14[poVar9->resno].bands;
            OVar11 = poVar14[poVar9->resno].numbands;
            uVar23 = 0;
            for (OVar8 = 0; OVar8 != OVar11; OVar8 = OVar8 + 1) {
              if ((poVar13->x1 != poVar13->x0) && (poVar13->y1 != poVar13->y0)) {
                uVar17 = poVar9->precno;
                poVar3 = poVar13->precincts;
                OVar25 = poVar3[uVar17].ch;
                OVar19 = poVar3[uVar17].cw;
                poVar26 = poVar3[uVar17].cblks.dec;
                for (iVar24 = 0; poVar9 = local_90, iVar24 != OVar25 * OVar19; iVar24 = iVar24 + 1)
                {
                  OVar22 = poVar26->numnewpasses;
                  if (OVar22 != 0) {
                    OVar30 = poVar26->numsegs;
                    poVar5 = poVar26->segs;
                    if (OVar30 == 0) {
                      OVar30 = 1;
                      poVar16 = poVar5;
LAB_001322e9:
                      poVar26->numsegs = OVar30;
                    }
                    else {
                      uVar17 = OVar30 - 1;
                      poVar16 = poVar5 + uVar17;
                      if (poVar5[uVar17].numpasses == poVar5[uVar17].maxpasses) {
                        OVar30 = OVar30 + 1;
                        poVar16 = poVar16 + 1;
                        goto LAB_001322e9;
                      }
                    }
                    do {
                      uVar28 = poVar16->newlen + uVar23;
                      bVar32 = uVar23 <= uVar28;
                      uVar17 = uVar28;
                      if (uVar28 > uVar21 || !bVar32) {
                        poVar16->newlen = uVar21 - uVar23;
                        uVar17 = uVar21;
                      }
                      uVar23 = uVar17;
                      OVar1 = poVar16->numnewpasses;
                      poVar16->numpasses = poVar16->numpasses + OVar1;
                      OVar15 = OVar22 - OVar1;
                      if (OVar15 != 0) {
                        poVar16 = poVar16 + 1;
                        OVar30 = OVar30 + 1;
                        poVar26->numsegs = OVar30;
                      }
                      bVar33 = OVar22 != OVar1;
                      OVar22 = OVar15;
                    } while ((uVar28 <= uVar21 && bVar32) && bVar33);
                    poVar26->numnewpasses = OVar15;
                  }
                  poVar26 = poVar26 + 1;
                }
              }
              poVar13 = poVar13 + 1;
            }
            uVar20 = (ulong)(uVar23 + local_d4);
            local_a8 = (ulong)local_d4;
            local_80 = uVar31;
          }
        }
        if (*(int *)((long)local_c8 + uVar31 * 4) != 0) {
          if (local_88->comps[uVar31].resno_decoded == 0) {
            local_88->comps[uVar31].resno_decoded =
                 local_c0->comps[uVar31].minimum_num_resolutions - 1;
          }
        }
        local_a0 = local_a0 + uVar20;
        local_b8 = (ulong)(uint)((int)local_b8 - (int)uVar20);
      }
      poVar9 = poVar9 + 1;
      opj_free(local_c8);
      uVar21 = local_70 + 1;
    }
    opj_pi_destroy(local_b0,local_d0);
    *local_40 = (int)local_a0 - (int)pOVar29;
    OVar7 = 1;
  }
  return OVar7;
}

Assistant:

OPJ_BOOL opj_t2_decode_packets(opj_tcd_t* tcd,
                               opj_t2_t *p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_BYTE *p_src,
                               OPJ_UINT32 * p_data_read,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_index_t *p_cstr_index,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_src;
    opj_pi_iterator_t *l_pi = 00;
    OPJ_UINT32 pino;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &(p_t2->cp->tcps[p_tile_no]);
    OPJ_UINT32 l_nb_bytes_read;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;
    opj_pi_iterator_t *l_current_pi = 00;
#ifdef TODO_MSD
    OPJ_UINT32 curtp = 0;
    OPJ_UINT32 tp_start_packno;
#endif
    opj_packet_info_t *l_pack_info = 00;
    opj_image_comp_t* l_img_comp = 00;

    OPJ_ARG_NOT_USED(p_cstr_index);

#ifdef TODO_MSD
    if (p_cstr_index) {
        l_pack_info = p_cstr_index->tile_index[p_tile_no].packet;
    }
#endif

    /* create a packet iterator */
    l_pi = opj_pi_create_decode(l_image, l_cp, p_tile_no);
    if (!l_pi) {
        return OPJ_FALSE;
    }


    l_current_pi = l_pi;

    for (pino = 0; pino <= l_tcp->numpocs; ++pino) {

        /* if the resolution needed is too low, one dim of the tilec could be equal to zero
         * and no packets are used to decode this resolution and
         * l_current_pi->resno is always >= p_tile->comps[l_current_pi->compno].minimum_num_resolutions
         * and no l_img_comp->resno_decoded are computed
         */
        OPJ_BOOL* first_pass_failed = NULL;

        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        first_pass_failed = (OPJ_BOOL*)opj_malloc(l_image->numcomps * sizeof(OPJ_BOOL));
        if (!first_pass_failed) {
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        memset(first_pass_failed, OPJ_TRUE, l_image->numcomps * sizeof(OPJ_BOOL));

        while (opj_pi_next(l_current_pi)) {
            OPJ_BOOL skip_packet = OPJ_FALSE;
            JAS_FPRINTF(stderr,
                        "packet offset=00000166 prg=%d cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d\n\n",
                        l_current_pi->poc.prg1, l_current_pi->compno, l_current_pi->resno,
                        l_current_pi->precno, l_current_pi->layno);

            /* If the packet layer is greater or equal than the maximum */
            /* number of layers, skip the packet */
            if (l_current_pi->layno >= l_tcp->num_layers_to_decode) {
                skip_packet = OPJ_TRUE;
            }
            /* If the packet resolution number is greater than the minimum */
            /* number of resolution allowed, skip the packet */
            else if (l_current_pi->resno >=
                     p_tile->comps[l_current_pi->compno].minimum_num_resolutions) {
                skip_packet = OPJ_TRUE;
            } else {
                /* If no precincts of any band intersects the area of interest, */
                /* skip the packet */
                OPJ_UINT32 bandno;
                opj_tcd_tilecomp_t *tilec = &p_tile->comps[l_current_pi->compno];
                opj_tcd_resolution_t *res = &tilec->resolutions[l_current_pi->resno];

                skip_packet = OPJ_TRUE;
                for (bandno = 0; bandno < res->numbands; ++bandno) {
                    opj_tcd_band_t* band = &res->bands[bandno];
                    opj_tcd_precinct_t* prec = &band->precincts[l_current_pi->precno];

                    if (opj_tcd_is_subband_area_of_interest(tcd,
                                                            l_current_pi->compno,
                                                            l_current_pi->resno,
                                                            band->bandno,
                                                            (OPJ_UINT32)prec->x0,
                                                            (OPJ_UINT32)prec->y0,
                                                            (OPJ_UINT32)prec->x1,
                                                            (OPJ_UINT32)prec->y1)) {
                        skip_packet = OPJ_FALSE;
                        break;
                    }
                }
                /*
                                printf("packet cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d -> %s\n",
                                    l_current_pi->compno, l_current_pi->resno,
                                    l_current_pi->precno, l_current_pi->layno, skip_packet ? "skipped" : "kept");
                */
            }

            if (!skip_packet) {
                l_nb_bytes_read = 0;

                first_pass_failed[l_current_pi->compno] = OPJ_FALSE;

                if (! opj_t2_decode_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                           &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }

                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                l_img_comp->resno_decoded = opj_uint_max(l_current_pi->resno,
                                            l_img_comp->resno_decoded);
            } else {
                l_nb_bytes_read = 0;
                if (! opj_t2_skip_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                         &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }
            }

            if (first_pass_failed[l_current_pi->compno]) {
                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                if (l_img_comp->resno_decoded == 0) {
                    l_img_comp->resno_decoded =
                        p_tile->comps[l_current_pi->compno].minimum_num_resolutions - 1;
                }
            }

            l_current_data += l_nb_bytes_read;
            p_max_len -= l_nb_bytes_read;

            /* INDEX >> */
#ifdef TODO_MSD
            if (p_cstr_info) {
                opj_tile_info_v2_t *info_TL = &p_cstr_info->tile[p_tile_no];
                opj_packet_info_t *info_PK = &info_TL->packet[p_cstr_info->packno];
                tp_start_packno = 0;
                if (!p_cstr_info->packno) {
                    info_PK->start_pos = info_TL->end_header + 1;
                } else if (info_TL->packet[p_cstr_info->packno - 1].end_pos >=
                           (OPJ_INT32)
                           p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_pos) { /* New tile part */
                    info_TL->tp[curtp].tp_numpacks = p_cstr_info->packno -
                                                     tp_start_packno; /* Number of packets in previous tile-part */
                    tp_start_packno = p_cstr_info->packno;
                    curtp++;
                    info_PK->start_pos = p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_header + 1;
                } else {
                    info_PK->start_pos = (l_cp->m_specific_param.m_enc.m_tp_on &&
                                          info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[p_cstr_info->packno -
                                                                      1].end_pos + 1;
                }
                info_PK->end_pos = info_PK->start_pos + l_nb_bytes_read - 1;
                info_PK->end_ph_pos += info_PK->start_pos -
                                       1;  /* End of packet header which now only represents the distance */
                ++p_cstr_info->packno;
            }
#endif
            /* << INDEX */
        }
        ++l_current_pi;

        opj_free(first_pass_failed);
    }
    /* INDEX >> */
#ifdef TODO_MSD
    if
    (p_cstr_info) {
        p_cstr_info->tile[p_tile_no].tp[curtp].tp_numpacks = p_cstr_info->packno -
                tp_start_packno; /* Number of packets in last tile-part */
    }
#endif
    /* << INDEX */

    /* don't forget to release pi */
    opj_pi_destroy(l_pi, l_nb_pocs);
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src);
    return OPJ_TRUE;
}